

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

bool crnlib::etc1_block::get_diff_subblock_colors
               (color_quad_u8 *pDst,uint16 packed_color5,uint16 packed_delta3,uint table_idx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uchar uVar8;
  ulong uVar9;
  color_quad_u8 result;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_2c;
  
  uVar9 = (ulong)table_idx;
  bVar1 = unpack_color5((color_quad_u8 *)&local_2c.field_0,packed_color5,packed_delta3,true,0xff);
  uVar4 = (uint)local_2c.field_0.r;
  uVar2 = (uint)local_2c.field_0.g;
  iVar3 = (&g_etc1_inten_tables)[uVar9 * 4];
  iVar7 = iVar3 + uVar2;
  iVar5 = iVar3 + (uint)local_2c.field_0.b;
  iVar6 = iVar3 + uVar4;
  if (0xfe < (int)(iVar3 + uVar4)) {
    iVar6 = 0xff;
  }
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  uVar8 = (uchar)iVar7;
  if (iVar7 < 1) {
    uVar8 = '\0';
  }
  iVar7 = (&DAT_001baf44)[uVar9 * 4];
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  (pDst->field_0).field_0.r = (uchar)iVar6;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  (pDst->field_0).field_0.g = uVar8;
  (pDst->field_0).field_0.b = (uchar)iVar5;
  iVar6 = iVar7 + (uint)local_2c.field_0.b;
  iVar3 = iVar7 + uVar4;
  if (0xfe < (int)(iVar7 + uVar4)) {
    iVar3 = 0xff;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  (pDst->field_0).field_0.a = 0xff;
  iVar5 = iVar7 + uVar2;
  if (0xfe < (int)(iVar7 + uVar2)) {
    iVar5 = 0xff;
  }
  pDst[1].field_0.field_0.r = (uchar)iVar3;
  uVar8 = (uchar)iVar5;
  if (iVar5 < 1) {
    uVar8 = '\0';
  }
  pDst[1].field_0.field_0.g = uVar8;
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  uVar8 = (uchar)iVar6;
  if (iVar6 < 1) {
    uVar8 = '\0';
  }
  pDst[1].field_0.field_0.b = uVar8;
  pDst[1].field_0.field_0.a = 0xff;
  iVar3 = *(int *)(&DAT_001baf48 + uVar9 * 0x10);
  iVar7 = iVar3 + uVar4;
  iVar6 = iVar3 + (uint)local_2c.field_0.b;
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  iVar5 = iVar3 + uVar2;
  if (0xfe < (int)(iVar3 + uVar2)) {
    iVar5 = 0xff;
  }
  pDst[2].field_0.field_0.r = (uchar)iVar7;
  uVar8 = (uchar)iVar5;
  if (iVar5 < 1) {
    uVar8 = '\0';
  }
  pDst[2].field_0.field_0.g = uVar8;
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  uVar8 = (uchar)iVar6;
  if (iVar6 < 1) {
    uVar8 = '\0';
  }
  pDst[2].field_0.field_0.b = uVar8;
  pDst[2].field_0.field_0.a = 0xff;
  iVar7 = *(int *)(&DAT_001baf4c + uVar9 * 0x10);
  iVar6 = uVar4 + iVar7;
  iVar3 = uVar2 + iVar7;
  iVar7 = iVar7 + (uint)local_2c.field_0.b;
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  uVar8 = (uchar)iVar6;
  if (iVar6 < 1) {
    uVar8 = '\0';
  }
  if (0xfe < iVar3) {
    iVar3 = 0xff;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  pDst[3].field_0.field_0.r = uVar8;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  pDst[3].field_0.field_0.g = (uchar)iVar3;
  pDst[3].field_0.field_0.b = (uchar)iVar7;
  pDst[3].field_0.field_0.a = 0xff;
  return bVar1;
}

Assistant:

bool etc1_block::get_diff_subblock_colors(color_quad_u8* pDst, uint16 packed_color5, uint16 packed_delta3, uint table_idx) {
  CRNLIB_ASSERT(table_idx < cETC1IntenModifierValues);
  const int* pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

  uint r, g, b;
  bool success = unpack_color5(r, g, b, packed_color5, packed_delta3, true);

  const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

  const int y0 = pInten_modifer_table[0];
  pDst[0].set(ir + y0, ig + y0, ib + y0);

  const int y1 = pInten_modifer_table[1];
  pDst[1].set(ir + y1, ig + y1, ib + y1);

  const int y2 = pInten_modifer_table[2];
  pDst[2].set(ir + y2, ig + y2, ib + y2);

  const int y3 = pInten_modifer_table[3];
  pDst[3].set(ir + y3, ig + y3, ib + y3);

  return success;
}